

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void sarimax_wrapper_predict
               (sarimax_wrapper_object obj,double *inp,double *xreg,int L,double *newxreg,
               double *xpred,double *amse)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int d;
  uint N;
  int D;
  int iVar6;
  sarimax_object psVar7;
  uint ip;
  int iVar8;
  double *C;
  double *C_00;
  double *oup;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  ulong uVar16;
  uint id;
  long lVar17;
  double dVar18;
  double *local_c0;
  double local_48;
  
  psVar7 = obj->sarimax;
  uVar1 = psVar7->p;
  uVar2 = psVar7->P;
  uVar3 = psVar7->Q;
  iVar4 = psVar7->s;
  lVar17 = (long)iVar4;
  ip = iVar4 * uVar2 + uVar1;
  uVar5 = psVar7->q;
  uVar12 = iVar4 * uVar3 + uVar5 + 1;
  if ((int)uVar12 < (int)ip) {
    uVar12 = ip;
  }
  d = psVar7->d;
  N = psVar7->N;
  D = psVar7->D;
  C = (double *)malloc((long)d * 8 + 8);
  iVar8 = iVar4 * D;
  C_00 = (double *)malloc((long)iVar8 * 8 + 8);
  id = iVar8 + d;
  oup = (double *)malloc((long)(int)id * 8 + 8);
  __size = (long)(int)N * 8;
  W = (double *)malloc(__size);
  resid = (double *)malloc(__size);
  iVar6 = obj->idrift;
  phi = (double *)malloc((long)(int)uVar12 << 3);
  theta = (double *)malloc((long)(int)uVar12 << 3);
  *C_00 = 1.0;
  *C = 1.0;
  if (D == 0 && d == 0) {
    *oup = 1.0;
    local_48 = psVar7->mean;
  }
  else {
    if (0 < d) {
      deld(d,C);
    }
    local_48 = 0.0;
    if (0 < D) {
      delds(D,iVar4,C_00);
    }
  }
  conv(C,d + 1,C_00,iVar8 + 1,oup);
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)id) {
    uVar10 = (ulong)id;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    oup[uVar9 + 1] = -oup[uVar9 + 1];
  }
  uVar10 = (ulong)(iVar6 == 1);
  uVar9 = 0;
  uVar13 = 0;
  local_c0 = xreg;
  if (0 < (int)N) {
    uVar13 = (ulong)N;
  }
  for (; uVar9 != uVar13; uVar9 = uVar9 + 1) {
    dVar18 = inp[uVar9];
    if (D == 0 && d == 0) {
      dVar18 = dVar18 - local_48;
    }
    W[uVar9] = dVar18;
    psVar7 = obj->sarimax;
    if (obj->idrift == 1) {
      dVar18 = dVar18 - (double)((int)uVar9 + 1) * *psVar7->exog;
      W[uVar9] = dVar18;
    }
    iVar6 = psVar7->r;
    pdVar15 = local_c0;
    uVar11 = uVar10;
    if (0 < (long)iVar6) {
      for (; (long)iVar6 != uVar11; uVar11 = uVar11 + 1) {
        dVar18 = dVar18 - psVar7->exog[uVar11] * *pdVar15;
        W[uVar9] = dVar18;
        pdVar15 = pdVar15 + (int)N;
      }
    }
    resid[uVar9] = psVar7->res[uVar9];
    local_c0 = local_c0 + 1;
  }
  uVar13 = 0;
  uVar9 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar9 = uVar13;
  }
  for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
    theta[uVar13] = 0.0;
    phi[uVar13] = 0.0;
  }
  uVar13 = 0;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar9 = uVar13;
  }
  for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
    phi[uVar13] = obj->sarimax->phi[uVar13];
  }
  uVar11 = 0;
  uVar13 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar13 = uVar11;
  }
  for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
    theta[uVar11] = -obj->sarimax->theta[uVar11];
  }
  uVar14 = 0;
  pdVar15 = phi;
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = uVar14;
  }
  while (pdVar15 = pdVar15 + lVar17, uVar14 != uVar11) {
    psVar7 = obj->sarimax;
    dVar18 = psVar7->PHI[uVar14];
    uVar14 = uVar14 + 1;
    phi[uVar14 * lVar17 + -1] = phi[uVar14 * lVar17 + -1] + dVar18;
    for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
      pdVar15[uVar16] = pdVar15[uVar16] - psVar7->phi[uVar16] * dVar18;
    }
  }
  uVar11 = 0;
  pdVar15 = theta;
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar9 = uVar11;
  }
  while (pdVar15 = pdVar15 + lVar17, uVar11 != uVar9) {
    psVar7 = obj->sarimax;
    dVar18 = psVar7->THETA[uVar11];
    uVar11 = uVar11 + 1;
    theta[uVar11 * lVar17 + -1] = theta[uVar11 * lVar17 + -1] - dVar18;
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      pdVar15[uVar14] = psVar7->theta[uVar14] * dVar18 + pdVar15[uVar14];
    }
  }
  forkal(ip,iVar4 * uVar3 + uVar5,id,phi,theta,oup + 1,N,W,resid,L,xpred,amse);
  uVar13 = 0;
  uVar9 = 0;
  if (0 < L) {
    uVar9 = (ulong)(uint)L;
  }
  for (; uVar13 != uVar9; uVar13 = uVar13 + 1) {
    dVar18 = xpred[uVar13] + local_48;
    xpred[uVar13] = dVar18;
    psVar7 = obj->sarimax;
    if (obj->idrift == 1) {
      dVar18 = dVar18 + (double)(int)(N + 1 + (int)uVar13) * *psVar7->exog;
      xpred[uVar13] = dVar18;
    }
    iVar4 = psVar7->r;
    pdVar15 = newxreg;
    for (uVar11 = uVar10; (long)uVar11 < (long)iVar4; uVar11 = uVar11 + 1) {
      dVar18 = dVar18 + psVar7->exog[uVar11] * *pdVar15;
      xpred[uVar13] = dVar18;
      pdVar15 = pdVar15 + L;
    }
    newxreg = newxreg + 1;
  }
  free(C);
  free(C_00);
  free(oup);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void sarimax_wrapper_predict(sarimax_wrapper_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j,diter;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->sarimax->d;
	N = obj->sarimax->N;
	p = obj->sarimax->p;
	q = obj->sarimax->q;
	D = obj->sarimax->D;
	P = obj->sarimax->P;
	Q = obj->sarimax->Q;
	s = obj->sarimax->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	diter = 0;

	if (obj->idrift == 1) {
		diter = 1;		
	}


	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->sarimax->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		if (obj->idrift == 1) {
			W[i] -= obj->sarimax->exog[0]*(i+1);
		}
		if (obj->sarimax->r > 0) {
			for(j = diter; j < obj->sarimax->r;++j) {
				W[i] -= obj->sarimax->exog[j] * xreg[(j-diter)*N+i];
			}
		}
		resid[i] = obj->sarimax->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->sarimax->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->sarimax->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->sarimax->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->sarimax->phi[i] * obj->sarimax->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->sarimax->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->sarimax->theta[i] * obj->sarimax->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
		if (obj->idrift == 1) {
			xpred[i] += obj->sarimax->exog[0]*(i+1+N);
		}
		for(j = diter; j < obj->sarimax->r;++j) {
			xpred[i] += obj->sarimax->exog[j] * newxreg[(j - diter)*L+i];
		}
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}